

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

int color_tree_get(ColorTree *tree,uchar r,uchar g,uchar b,uchar a)

{
  int iVar1;
  byte bVar2;
  int local_28;
  int local_20;
  int i;
  int bit;
  uchar a_local;
  uchar b_local;
  uchar g_local;
  uchar r_local;
  ColorTree *tree_local;
  
  local_20 = 0;
  _bit = tree;
  while( true ) {
    if (7 < local_20) {
      if (_bit == (ColorTree *)0x0) {
        local_28 = -1;
      }
      else {
        local_28 = _bit->index;
      }
      return local_28;
    }
    bVar2 = (byte)local_20;
    iVar1 = ((int)(uint)r >> (bVar2 & 0x1f) & 1U) * 8 + ((int)(uint)g >> (bVar2 & 0x1f) & 1U) * 4 +
            ((int)(uint)b >> (bVar2 & 0x1f) & 1U) * 2 + ((int)(uint)a >> (bVar2 & 0x1f) & 1U);
    if (_bit->children[iVar1] == (ColorTree *)0x0) break;
    _bit = _bit->children[iVar1];
    local_20 = local_20 + 1;
  }
  return -1;
}

Assistant:

static int color_tree_get(ColorTree* tree, unsigned char r, unsigned char g, unsigned char b, unsigned char a) {
  int bit = 0;
  for(bit = 0; bit < 8; ++bit) {
    int i = 8 * ((r >> bit) & 1) + 4 * ((g >> bit) & 1) + 2 * ((b >> bit) & 1) + 1 * ((a >> bit) & 1);
    if(!tree->children[i]) return -1;
    else tree = tree->children[i];
  }
  return tree ? tree->index : -1;
}